

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void __thiscall
Centaurus::SkipRoutineEM64T<char>::SkipRoutineEM64T
          (SkipRoutineEM64T<char> *this,CharClass<char> *filter,Logger *logger)

{
  CodeHolder *code;
  CodeHolder *this_00;
  Logger *logger_00;
  uint32_t instId;
  undefined8 in_stack_fffffffffffffcc8;
  undefined1 local_328 [8];
  Label rejectlabel;
  MyConstPool pool;
  undefined1 local_1e0 [8];
  X86Assembler as;
  Logger *logger_local;
  CharClass<char> *filter_local;
  SkipRoutineEM64T<char> *this_local;
  uint32_t signature;
  
  this->_vptr_SkipRoutineEM64T = (_func_int **)&PTR__SkipRoutineEM64T_00284840;
  this_00 = (CodeHolder *)&this->m_runtime;
  as.super_Assembler._op5.field_0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)logger;
  asmjit::JitRuntime::JitRuntime((JitRuntime *)this_00);
  logger_00 = (Logger *)&this->m_code;
  asmjit::CodeHolder::CodeHolder(this_00);
  asmjit::CodeHolder::init
            (&this->m_code,
             (EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (as.super_Assembler._op5.field_0._mem.field_2 != 0) {
    asmjit::CodeHolder::setLogger((CodeHolder *)this,logger_00);
  }
  instId = (uint32_t)((ulong)logger_00 >> 0x20);
  code = (CodeHolder *)local_1e0;
  asmjit::X86Assembler::X86Assembler((X86Assembler *)this_00,code);
  emit_parser_prolog((X86Assembler *)code);
  asmjit::CodeEmitter::emit((CodeEmitter *)this,instId,(Operand_ *)this_00,(Operand_ *)code);
  MyConstPool::MyConstPool
            ((MyConstPool *)((long)&rejectlabel.super_Operand.super_Operand_.field_0 + 8),
             (X86Assembler *)local_1e0);
  asmjit::Assembler::newLabel((Assembler *)in_stack_fffffffffffffcc8);
  MyConstPool::load_charclass_filter<char>
            ((MyConstPool *)((long)&rejectlabel.super_Operand.super_Operand_.field_0 + 8),
             (X86Xmm *)&stack0xfffffffffffffcc8,filter);
  emit((X86Assembler *)local_1e0);
  emit_parser_epilog((X86Assembler *)local_1e0,(Label *)local_328);
  MyConstPool::embed((MyConstPool *)((long)&rejectlabel.super_Operand.super_Operand_.field_0 + 8));
  asmjit::CodeEmitter::finalize((CodeEmitter *)local_1e0);
  MyConstPool::~MyConstPool
            ((MyConstPool *)((long)&rejectlabel.super_Operand.super_Operand_.field_0 + 8));
  asmjit::X86Assembler::~X86Assembler((X86Assembler *)0x17a0c6);
  return;
}

Assistant:

SkipRoutineEM64T<TCHAR>::SkipRoutineEM64T(const CharClass<TCHAR>& filter, asmjit::Logger *logger)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);

    asmjit::X86Assembler as(&m_code);

    emit_parser_prolog(as);

    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));

    MyConstPool pool(as);

    asmjit::Label rejectlabel = as.newLabel();

    pool.load_charclass_filter(PATTERN_REG, filter);
    
    emit(as);

    emit_parser_epilog(as, rejectlabel);

    pool.embed();

    as.finalize();
}